

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getBranchChangeLocations
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join,
          VectorSet<const_llvm::Value_*> *froms)

{
  pointer ppVVar1;
  pointer ppVVar2;
  bool bVar3;
  uint i;
  ulong uVar4;
  pointer ppVVar5;
  VectorSet<const_llvm::Value_*> *__range3;
  VRLocation *loc;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> changeLocations;
  V from;
  VRLocation *local_60;
  _Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> local_58;
  Value *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  do {
    ppVVar1 = (join->predecessors).
              super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((ulong)((long)(join->predecessors).
                       super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3 & 0xffffffff)
        <= uVar4) {
      (__return_storage_ptr__->
      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
      _M_impl.super__Vector_impl_data._M_start = local_58._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = local_58._M_impl.super__Vector_impl_data._M_finish
      ;
      (__return_storage_ptr__->
      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00134074:
      std::_Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::
      ~_Vector_base(&local_58);
      return __return_storage_ptr__;
    }
    local_60 = ppVVar1[uVar4]->source;
    ppVVar5 = (froms->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar2 = (froms->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (ppVVar5 == ppVVar2) {
        (__return_storage_ptr__->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_00134074;
      }
      local_38 = *ppVVar5;
      bVar3 = ValueRelations::hasLoad<llvm::Value_const*>(&local_60->relations,&local_38);
      ppVVar5 = ppVVar5 + 1;
    } while (!bVar3);
    std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
    emplace_back<dg::vr::VRLocation*&>
              ((vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>> *)
               &local_58,&local_60);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getBranchChangeLocations(const VRLocation &join,
                                            const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations;
    for (unsigned i = 0; i < join.predsSize(); ++i) {
        auto loc = join.getPredLocation(i);
        bool hasLoad = false;
        for (V from : froms) {
            if (loc->relations.hasLoad(from)) {
                hasLoad = true;
                break;
            }
        }
        if (!hasLoad)
            return {};
        changeLocations.emplace_back(loc);
    }
    return changeLocations;
}